

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecAnalyzerResults.cpp
# Opt level: O2

void __thiscall HdmiCecAnalyzerResults::GenOpCodeBubble(HdmiCecAnalyzerResults *this,Frame *frame)

{
  U64 number;
  char *pcVar1;
  string local_d0;
  string opCodeStr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string opCodeText;
  
  number = *(U64 *)(frame + 0x10);
  GetNumberString_abi_cxx11_(&opCodeStr,this,number,8);
  pcVar1 = HdmiCec::GetOpCodeString((OpCode)number);
  std::__cxx11::string::string((string *)&opCodeText,pcVar1,(allocator *)&local_d0);
  if (this->mTabular == false) {
    std::__cxx11::string::string((string *)&local_d0,"O",(allocator *)&local_90);
    AddResult(this,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::operator+(&local_d0,"Op. ",&opCodeStr);
    AddResult(this,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::operator+(&local_d0,"Opcode ",&opCodeStr);
    AddResult(this,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  std::operator+(&local_70,"Opcode ",&opCodeStr);
  std::operator+(&local_50,&local_70," (");
  std::operator+(&local_90,&local_50,&opCodeText);
  std::operator+(&local_d0,&local_90,")");
  AddResult(this,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&opCodeText);
  std::__cxx11::string::~string((string *)&opCodeStr);
  return;
}

Assistant:

void HdmiCecAnalyzerResults::GenOpCodeBubble( const Frame& frame )
{
    HdmiCec::OpCode opCode = static_cast<HdmiCec::OpCode>( frame.mData1 );
    std::string opCodeStr = GetNumberString( frame.mData1, 8 );
    std::string opCodeText = HdmiCec::GetOpCodeString( opCode );

    if( !mTabular )
    {
        AddResult( "O" );
        AddResult( "Op. " + opCodeStr );
        AddResult( "Opcode " + opCodeStr );
    }
    AddResult( "Opcode " + opCodeStr + " (" + opCodeText + ")" );
}